

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O0

uint8_t __thiscall duckdb::BitReader::InnerReadByte(BitReader *this,uint8_t *offset)

{
  uint8_t uVar1;
  byte bVar2;
  uint8_t *puVar3;
  byte bVar4;
  byte bVar5;
  uint8_t uVar6;
  uint64_t uVar7;
  byte *in_RSI;
  BitReader *in_RDI;
  uint8_t result;
  
  puVar3 = in_RDI->input;
  uVar7 = ByteIndex(in_RDI);
  uVar1 = puVar3[uVar7 + *in_RSI];
  bVar4 = BitIndex(in_RDI);
  puVar3 = in_RDI->input;
  uVar7 = ByteIndex(in_RDI);
  bVar2 = puVar3[uVar7 + *in_RSI + 1];
  bVar5 = BitIndex(in_RDI);
  bVar5 = REMAINDER_MASKS[(int)(bVar5 + 8)];
  uVar6 = BitIndex(in_RDI);
  return uVar1 << (bVar4 & 0x1f) | (byte)((int)(uint)(bVar2 & bVar5) >> (8 - uVar6 & 0x1f));
}

Assistant:

inline uint8_t InnerReadByte(const uint8_t &offset) {
		uint8_t result = static_cast<uint8_t>(input[ByteIndex() + offset] << BitIndex()) |
		                 ((input[ByteIndex() + offset + 1] & REMAINDER_MASKS[8 + BitIndex()]) >> (8 - BitIndex()));
		return result;
	}